

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

ChAparticle * __thiscall chrono::ChAparticle::operator=(ChAparticle *this,ChAparticle *other)

{
  if (other != this) {
    ChParticleBase::operator=(&this->super_ChParticleBase,&other->super_ChParticleBase);
    (*this->collision_model->_vptr_ChCollisionModel[3])();
    (*this->collision_model->_vptr_ChCollisionModel[0x14])
              (this->collision_model,other->collision_model);
    (*this->collision_model->_vptr_ChCollisionModel[0x16])
              (this->collision_model,&this->super_ChContactable_1vars<6>);
    this->container = other->container;
    (this->UserForce).m_data[0] = (other->UserForce).m_data[0];
    (this->UserForce).m_data[1] = (other->UserForce).m_data[1];
    (this->UserForce).m_data[2] = (other->UserForce).m_data[2];
    (this->UserTorque).m_data[0] = (other->UserTorque).m_data[0];
    (this->UserTorque).m_data[1] = (other->UserTorque).m_data[1];
    (this->UserTorque).m_data[2] = (other->UserTorque).m_data[2];
    ChVariablesBodySharedMass::operator=(&this->variables,&other->variables);
  }
  return this;
}

Assistant:

ChAparticle& ChAparticle::operator=(const ChAparticle& other) {
    if (&other == this)
        return *this;

    // parent class copy
    ChParticleBase::operator=(other);

    collision_model->ClearModel();
    collision_model->AddCopyOfAnotherModel(other.collision_model);
    collision_model->SetContactable(this);

    container = other.container;
    UserForce = other.UserForce;
    UserTorque = other.UserTorque;
    variables = other.variables;

    return *this;
}